

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphStatistics.cpp
# Opt level: O3

void __thiscall floorplan::GraphStatistics::generateCategoryCountDist(GraphStatistics *this)

{
  pointer pdVar1;
  pointer pdVar2;
  double *pdVar3;
  pointer pdVar4;
  mapped_type *pmVar5;
  pointer paVar6;
  ulong uVar7;
  AdjList *g;
  ulong uVar8;
  ulong uVar9;
  StoredVertex *sv;
  _List_node_base *p_Var10;
  floorplanGraph G;
  adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_Space,_spaceEdge,_graphProperties,_boost::listS>
  aStack_68;
  
  if ((this->_labels).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->_labels).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    uVar9 = 1;
    uVar7 = 0;
    do {
      uVar8 = uVar9;
      pdVar4 = (pointer)operator_new(8);
      *pdVar4 = 0.0;
      pmVar5 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>_>_>
               ::operator[](&this->_categoryCountDistByLabel,
                            (this->_labels).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + uVar7);
      pdVar1 = (pmVar5->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pdVar2 = (pmVar5->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_end_of_storage;
      (pmVar5->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
      _M_start = pdVar4;
      (pmVar5->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
      _M_finish = pdVar4 + 1;
      (pmVar5->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
      _M_end_of_storage = pdVar4 + 1;
      if (pdVar1 != (pointer)0x0) {
        operator_delete(pdVar1,(long)pdVar2 - (long)pdVar1);
      }
      uVar9 = (ulong)((int)uVar8 + 1);
      uVar7 = uVar8;
    } while (uVar8 < (ulong)((long)(this->_labels).
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(this->_labels).
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 5));
  }
  paVar6 = (this->_database->_graphs).
           super__Vector_base<boost::adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_Space,_spaceEdge,_graphProperties,_boost::listS>,_std::allocator<boost::adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_Space,_spaceEdge,_graphProperties,_boost::listS>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->_database->_graphs).
      super__Vector_base<boost::adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_Space,_spaceEdge,_graphProperties,_boost::listS>,_std::allocator<boost::adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_Space,_spaceEdge,_graphProperties,_boost::listS>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != paVar6) {
    uVar9 = 0;
    do {
      boost::
      adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_Space,_spaceEdge,_graphProperties,_boost::listS>
      ::adjacency_list(&aStack_68,paVar6 + uVar9);
      for (p_Var10 = aStack_68.super_type.m_vertices.
                     super__List_base<void_*,_std::allocator<void_*>_>._M_impl._M_node.
                     super__List_node_base._M_next;
          p_Var10 != (_List_node_base *)&aStack_68.super_type.m_vertices; p_Var10 = p_Var10->_M_next
          ) {
        pmVar5 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>_>_>
                 ::operator[](&this->_categoryCountDistByLabel,
                              (key_type *)&p_Var10[1]._M_next[1]._M_prev);
        pdVar3 = (pmVar5->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        *pdVar3 = *pdVar3 + 1.0;
      }
      boost::scoped_ptr<graphProperties>::~scoped_ptr(&aStack_68.m_property);
      boost::
      adj_list_impl<boost::adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_Space,_spaceEdge,_graphProperties,_boost::listS>,_boost::detail::adj_list_gen<boost::adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_Space,_spaceEdge,_graphProperties,_boost::listS>,_boost::listS,_boost::listS,_boost::undirectedS,_Space,_spaceEdge,_graphProperties,_boost::listS>::config,_boost::undirected_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_Space,_spaceEdge,_graphProperties,_boost::listS>,_boost::listS,_boost::listS,_boost::undirectedS,_Space,_spaceEdge,_graphProperties,_boost::listS>::config>_>
      ::~adj_list_impl(&aStack_68.super_type);
      uVar9 = (ulong)((int)uVar9 + 1);
      paVar6 = (this->_database->_graphs).
               super__Vector_base<boost::adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_Space,_spaceEdge,_graphProperties,_boost::listS>,_std::allocator<boost::adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_Space,_spaceEdge,_graphProperties,_boost::listS>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar7 = ((long)(this->_database->_graphs).
                     super__Vector_base<boost::adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_Space,_spaceEdge,_graphProperties,_boost::listS>,_std::allocator<boost::adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_Space,_spaceEdge,_graphProperties,_boost::listS>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)paVar6 >> 3) *
              0x6db6db6db6db6db7;
    } while (uVar9 <= uVar7 && uVar7 - uVar9 != 0);
  }
  return;
}

Assistant:

void GraphStatistics::generateCategoryCountDist(){
    for(unsigned int i = 0; i < _labels.size(); i++)
        _categoryCountDistByLabel[_labels[i]] = vector<double>(1, 0);

    /* Fill up the labels and categoryCount container */
    for (unsigned int i = 0; i < _database->getGraphs().size(); i++){
        floorplanGraph G = _database->getGraphs()[i];
        BGL_FORALL_VERTICES(v, G, floorplanGraph){
            _categoryCountDistByLabel[G[v].category][0]++;
        }
    }
}